

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeQueue.hpp
# Opt level: O0

void __thiscall
crsGA::ThreadSafeQueue<std::function<void_()>_>::push
          (ThreadSafeQueue<std::function<void_()>_> *this,function<void_()> *new_value)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  function<void_()> *new_value_local;
  ThreadSafeQueue<std::function<void_()>_> *this_local;
  
  lock._M_device = (mutex_type *)new_value;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mtx);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push(&this->_data,(value_type *)lock._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void push(T&& new_value)
        {
            std::lock_guard<std::mutex> lock(_mtx);
            _data.push(std::move(new_value));
            _data_cond.notify_one();
        }